

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_tail_link(ASMState *as)

{
  uint *puVar1;
  bool bVar2;
  BCIns *retpc;
  uint *puStack_50;
  int32_t mres;
  BCIns *pc;
  BCReg baseslot;
  int gotframe;
  SnapShot *snap;
  ASMState *pAStack_30;
  SnapNo snapno;
  ASMState *as_local;
  ulong local_20;
  uint64_t pcbase;
  uint local_c;
  
  snap._4_4_ = as->T->nsnap - 1;
  _baseslot = as->T->snap + snap._4_4_;
  pc._4_4_ = 0;
  pAStack_30 = as;
  pc._0_4_ = asm_baseslot(as,_baseslot,(int *)((long)&pc + 4));
  pAStack_30->topslot = (uint)_baseslot->topslot;
  as_local = pAStack_30;
  if (pAStack_30->mclim <= pAStack_30->mcp) {
    ra_allocref(pAStack_30,0x8000,4);
    if (pAStack_30->T->link == 0) {
      pcbase = (uint64_t)(pAStack_30->T->snapmap + (_baseslot->mapofs + (uint)_baseslot->nent));
      local_20 = *(ulong *)pcbase;
      puStack_50 = (uint *)(local_20 >> 8);
      if ((*puStack_50 & 0xff) == 0x57) {
        puVar1 = (uint *)(pAStack_30->J->trace[*puStack_50 >> 0x10].gcptr64 + 0x50);
        local_c = *puVar1 & 0xff;
        bVar2 = true;
        if (((local_c != 0x49) && (bVar2 = true, local_c != 0x4a)) &&
           (bVar2 = true, local_c != 0x4b)) {
          bVar2 = local_c == 0x4c;
        }
        if (bVar2) {
          puStack_50 = puVar1;
        }
      }
      emit_loadu64(pAStack_30,3,(uint64_t)puStack_50);
      retpc._4_4_ = ~(BCReg)pc + (uint)_baseslot->nslots;
      switch((char)*puStack_50) {
      case '?':
        retpc._4_4_ = retpc._4_4_ - (*puStack_50 >> 8 & 0xff);
        break;
      default:
        if ((*puStack_50 & 0xff) < 0x59) {
          retpc._4_4_ = 0;
        }
        break;
      case 'A':
      case 'C':
        retpc._4_4_ = retpc._4_4_ - ((*puStack_50 >> 8 & 0xff) + 2 + (*puStack_50 >> 0x10 & 0xff));
        break;
      case 'I':
        retpc._4_4_ = retpc._4_4_ - ((*puStack_50 >> 8 & 0xff) + (*puStack_50 >> 0x10));
      }
      emit_loadi(pAStack_30,0,retpc._4_4_);
    }
    else if ((BCReg)pc != 0) {
      emit_rma(pAStack_30,XO_MOVto,0x80202,pAStack_30->J[-1].penalty + 0x3c);
    }
    emit_addptr(pAStack_30,2,(BCReg)pc << 3);
    if (pAStack_30->J->ktrace != 0) {
      pAStack_30->ir[(ulong)pAStack_30->J->ktrace + 1] = (IRIns)pAStack_30->J->curfinal;
      *(undefined1 *)((long)pAStack_30->ir + (ulong)pAStack_30->J->ktrace * 8 + 5) = 0x18;
    }
    asm_stack_restore(pAStack_30,_baseslot);
    if ((pAStack_30->parent == (GCtrace *)0x0) && (pc._4_4_ != 0)) {
      asm_stack_check(pAStack_30,pAStack_30->topslot,(IRIns *)0x0,pAStack_30->freeset & 0xbfef,
                      snap._4_4_);
    }
    return;
  }
  asm_mclimit(pAStack_30);
}

Assistant:

static void asm_tail_link(ASMState *as)
{
  SnapNo snapno = as->T->nsnap-1;  /* Last snapshot. */
  SnapShot *snap = &as->T->snap[snapno];
  int gotframe = 0;
  BCReg baseslot = asm_baseslot(as, snap, &gotframe);

  as->topslot = snap->topslot;
  checkmclim(as);
  ra_allocref(as, REF_BASE, RID2RSET(RID_BASE));

  if (as->T->link == 0) {
    /* Setup fixed registers for exit to interpreter. */
    const BCIns *pc = snap_pc(&as->T->snapmap[snap->mapofs + snap->nent]);
    int32_t mres;
    if (bc_op(*pc) == BC_JLOOP) {  /* NYI: find a better way to do this. */
      BCIns *retpc = &traceref(as->J, bc_d(*pc))->startins;
      if (bc_isret(bc_op(*retpc)))
	pc = retpc;
    }
#if LJ_GC64
    emit_loadu64(as, RID_LPC, u64ptr(pc));
#else
    ra_allockreg(as, i32ptr(J2GG(as->J)->dispatch), RID_DISPATCH);
    ra_allockreg(as, i32ptr(pc), RID_LPC);
#endif
    mres = (int32_t)(snap->nslots - baseslot - LJ_FR2);
    switch (bc_op(*pc)) {
    case BC_CALLM: case BC_CALLMT:
      mres -= (int32_t)(1 + LJ_FR2 + bc_a(*pc) + bc_c(*pc)); break;
    case BC_RETM: mres -= (int32_t)(bc_a(*pc) + bc_d(*pc)); break;
    case BC_TSETM: mres -= (int32_t)bc_a(*pc); break;
    default: if (bc_op(*pc) < BC_FUNCF) mres = 0; break;
    }
    ra_allockreg(as, mres, RID_RET);  /* Return MULTRES or 0. */
  } else if (baseslot) {
    /* Save modified BASE for linking to trace with higher start frame. */
    emit_setgl(as, RID_BASE, jit_base);
  }
  emit_addptr(as, RID_BASE, 8*(int32_t)baseslot);

  if (as->J->ktrace) {  /* Patch ktrace slot with the final GCtrace pointer. */
    setgcref(IR(as->J->ktrace)[LJ_GC64].gcr, obj2gco(as->J->curfinal));
    IR(as->J->ktrace)->o = IR_KGC;
  }

  /* Sync the interpreter state with the on-trace state. */
  asm_stack_restore(as, snap);

  /* Root traces that add frames need to check the stack at the end. */
  if (!as->parent && gotframe)
    asm_stack_check(as, as->topslot, NULL, as->freeset & RSET_GPR, snapno);
}